

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::Data
          (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *this,
          Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *other)

{
  Span *pSVar1;
  Entry *pEVar2;
  ulong uVar3;
  Node<QByteArray,_QByteArray> *this_00;
  long lVar4;
  size_t sVar5;
  size_t sVar6;
  long in_FS_OFFSET;
  R RVar7;
  Bucket local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar5 = other->numBuckets;
  sVar6 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar6;
  this->spans = (Span *)0x0;
  RVar7 = allocateSpans(sVar5);
  this->spans = (Span *)RVar7.spans;
  lVar4 = 0;
  for (sVar5 = 0; sVar5 != RVar7.nSpans; sVar5 = sVar5 + 1) {
    pSVar1 = other->spans;
    for (sVar6 = 0; sVar6 != 0x80; sVar6 = sVar6 + 1) {
      uVar3 = (ulong)pSVar1->offsets[sVar6 + lVar4];
      if (uVar3 != 0xff) {
        pEVar2 = pSVar1[sVar5].entries;
        local_48.span = this->spans + sVar5;
        local_48.index = sVar6;
        this_00 = Bucket::insert(&local_48);
        Node<QByteArray,_QByteArray>::Node(this_00,(Node<QByteArray,_QByteArray> *)(pEVar2 + uVar3))
        ;
      }
    }
    lVar4 = lVar4 + 0x90;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }